

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeIdentifier(Parser *this,string *output,ErrorMaker error)

{
  bool bVar1;
  Token *pTVar2;
  string *output_local;
  Parser *this_local;
  ErrorMaker error_local;
  
  bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=((string *)output,(string *)&pTVar2->text);
    io::Tokenizer::Next(this->input_);
  }
  else {
    RecordError(this,error);
  }
  return bVar1;
}

Assistant:

bool Parser::ConsumeIdentifier(std::string* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    *output = input_->current().text;
    input_->Next();
    return true;
  } else {
    RecordError(error);
    return false;
  }
}